

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall
DataFilters::StringFilter::StringFilter
          (StringFilter *this,string *pattern,bool *isExact,bool *isSensitive,bool *isAccept)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)this,(string *)pattern);
  this->_isExact = *isExact;
  this->_isSensitive = *isSensitive;
  this->_isAccept = *isAccept;
  if (*isSensitive == false) {
    pcVar1 = (this->_pattern)._M_dataplus._M_p;
    sVar2 = (this->_pattern)._M_string_length;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      iVar3 = toupper((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
    }
  }
  return;
}

Assistant:

StringFilter(std::string const & pattern,
                     bool const & isExact = true,
                     bool const & isSensitive = true,
                     bool const & isAccept = true) :
                        _pattern(pattern),
                        _isExact(isExact),
                        _isSensitive(isSensitive),
                        _isAccept(isAccept)
        {
            if (!isSensitive)
            {
                std::transform(this->_pattern.begin(), this->_pattern.end(), this->_pattern.begin(), ::toupper);
            }
        }